

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::AuthenticatedStream> * __thiscall
kj::Maybe<kj::AuthenticatedStream>::operator=
          (Maybe<kj::AuthenticatedStream> *this,Maybe<kj::AuthenticatedStream> *other)

{
  kj::_::NullableValue<kj::AuthenticatedStream>::operator=(&this->ptr,&other->ptr);
  operator=(other);
  return this;
}

Assistant:

inline Maybe& operator=(Maybe&& other) { ptr = kj::mv(other.ptr); other = kj::none; return *this; }